

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmNtk.c
# Opt level: O3

void Sfm_CheckConsistency(Vec_Wec_t *vFanins,int nPis,int nPos,Vec_Str_t *vFixed)

{
  uint uVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  
  lVar2 = (long)vFanins->nSize;
  if (0 < lVar2) {
    lVar4 = 0;
    do {
      uVar1 = vFanins->pArray[lVar4].nSize;
      if (lVar4 < nPis) {
        if ((ulong)uVar1 != 0) {
LAB_00538974:
          __assert_fail("Vec_IntSize(vArray) == 0 && Vec_StrEntry(vFixed, i) == (char)0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sfm/sfmNtk.c"
                        ,0x36,"void Sfm_CheckConsistency(Vec_Wec_t *, int, int, Vec_Str_t *)");
        }
        if (vFixed->nSize <= lVar4) {
LAB_00538993:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecStr.h"
                        ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
        }
        if (vFixed->pArray[lVar4] != '\0') goto LAB_00538974;
        if (lVar2 - nPos <= lVar4) goto LAB_00538955;
      }
      else {
        if (0 < (int)uVar1) {
          uVar3 = 0;
          do {
            if (vFanins->nSize <= vFanins->pArray[lVar4].pArray[uVar3] + nPos) {
              __assert_fail("Fanin + nPos < Vec_WecSize(vFanins)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sfm/sfmNtk.c"
                            ,0x3a,"void Sfm_CheckConsistency(Vec_Wec_t *, int, int, Vec_Str_t *)");
            }
            uVar3 = uVar3 + 1;
          } while (uVar1 != uVar3);
        }
        if (lVar2 - nPos <= lVar4) {
          if (uVar1 != 1) {
LAB_00538955:
            __assert_fail("Vec_IntSize(vArray) == 1 && Vec_StrEntry(vFixed, i) == (char)0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sfm/sfmNtk.c"
                          ,0x3d,"void Sfm_CheckConsistency(Vec_Wec_t *, int, int, Vec_Str_t *)");
          }
          if (vFixed->nSize <= lVar4) goto LAB_00538993;
          if (vFixed->pArray[lVar4] != '\0') goto LAB_00538955;
        }
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 != lVar2);
  }
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    []

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Sfm_CheckConsistency( Vec_Wec_t * vFanins, int nPis, int nPos, Vec_Str_t * vFixed )
{
    Vec_Int_t * vArray;
    int i, k, Fanin;
    // check entries
    Vec_WecForEachLevel( vFanins, vArray, i )
    {
        // PIs have no fanins
        if ( i < nPis )
            assert( Vec_IntSize(vArray) == 0 && Vec_StrEntry(vFixed, i) == (char)0 );
        // nodes are in a topo order; POs cannot be fanins
        Vec_IntForEachEntry( vArray, Fanin, k )
//            assert( Fanin < i && Fanin + nPos < Vec_WecSize(vFanins) );
            assert( Fanin + nPos < Vec_WecSize(vFanins) );
        // POs have one fanout
        if ( i + nPos >= Vec_WecSize(vFanins) )
            assert( Vec_IntSize(vArray) == 1 && Vec_StrEntry(vFixed, i) == (char)0 );
    }
}